

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::anon_unknown_1::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  Mutex *this_00;
  hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *collection;
  DescriptorPool *pDVar1;
  second_type pMVar2;
  DescriptorPool *pDVar3;
  second_type p_Var4;
  LogMessage *pLVar5;
  Descriptor *type_local;
  LogFinisher local_61;
  WriterMutexLock lock;
  ReaderMutexLock lock_1;
  
  this_00 = &this->mutex_;
  type_local = type;
  lock_1.mu_ = this_00;
  internal::Mutex::Lock(this_00);
  collection = &this->type_map_;
  pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                     (collection,&type_local);
  internal::MutexLock::~MutexLock(&lock_1);
  if (pMVar2 == (second_type)0x0) {
    pDVar1 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    pDVar3 = DescriptorPool::generated_pool();
    if (pDVar1 == pDVar3) {
      lock_1.mu_ = *(Mutex **)**(undefined8 **)(type_local + 0x10);
      p_Var4 = FindPtrOrNull<google::protobuf::hash_map<char_const*,void(*)(std::__cxx11::string_const&),google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>>>>
                         (&this->file_map_,(first_type *)&lock_1);
      if (p_Var4 != (second_type)0x0) {
        lock.mu_ = this_00;
        internal::Mutex::Lock(this_00);
        pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                           (collection,&type_local);
        if (pMVar2 == (second_type)0x0) {
          (*p_Var4)((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    **(undefined8 **)(type_local + 0x10));
          pMVar2 = FindPtrOrNull<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (collection,&type_local);
          if (pMVar2 == (second_type)0x0) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&lock_1,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                       ,0x15f);
            pLVar5 = internal::LogMessage::operator<<
                               ((LogMessage *)&lock_1,
                                "Type appears to be in generated pool but wasn\'t ");
            pLVar5 = internal::LogMessage::operator<<(pLVar5,"registered: ");
            pLVar5 = internal::LogMessage::operator<<(pLVar5,*(string **)(type_local + 8));
            internal::LogFinisher::operator=(&local_61,pLVar5);
            internal::LogMessage::~LogMessage((LogMessage *)&lock_1);
            pMVar2 = (second_type)0x0;
          }
        }
        internal::MutexLock::~MutexLock(&lock);
        return pMVar2;
      }
      internal::LogMessage::LogMessage
                ((LogMessage *)&lock_1,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                 ,0x14e);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)&lock_1,
                          "File appears to be in generated pool but wasn\'t registered: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,(string *)**(undefined8 **)(type_local + 0x10));
      internal::LogFinisher::operator=((LogFinisher *)&lock,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&lock_1);
    }
    pMVar2 = (second_type)0x0;
  }
  return pMVar2;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  RegistrationFunc* registration_func =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_func == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: " << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    registration_func(type->file()->name());
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}